

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXCompilerLibrary.hpp
# Opt level: O2

Version __thiscall Diligent::DXCompilerLibrary::GetVersion(DXCompilerLibrary *this)

{
  string msg;
  
  if (((this->m_Loaded)._M_base._M_i & 1U) == 0) {
    FormatString<char[33]>(&msg,(char (*) [33])"DXCompiler library is not loaded");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetVersion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/include/DXCompilerLibrary.hpp"
               ,0x5d);
    std::__cxx11::string::~string((string *)&msg);
  }
  return this->m_Version;
}

Assistant:

Version GetVersion() const
    {
        VERIFY(m_Loaded.load(), "DXCompiler library is not loaded");
        return m_Version;
    }